

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O3

void __thiscall ExternalTester::ExternalTester(ExternalTester *this,int in_num_mc)

{
  vector<TestType,_std::allocator<TestType>_> *__result;
  iterator __position;
  back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_> __result_00;
  back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_> __result_01;
  pointer pTVar1;
  initializer_list<TasGrid::TypeAcceleration> __l;
  TypeAcceleration acc;
  allocator_type local_151;
  back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_> local_150;
  vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_> local_148;
  vector<TestType,std::allocator<TestType>> *local_130;
  back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_> local_128;
  vector<TestType,std::allocator<TestType>> *local_120;
  back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_> local_118;
  vector<TasGrid::TypeAcceleration,std::allocator<TasGrid::TypeAcceleration>> *local_110;
  Two3KExpSinCos *local_108;
  SixteenOneActive3 *local_100;
  TwoOneConformalOne *local_f8;
  TwoOneExpShiftedDomain *local_f0;
  TwoTwoExpAsym *local_e8;
  TwoOneENX2aniso *local_e0;
  TwoOneConstGH *local_d8;
  TwoOneConstGGL *local_d0;
  TwoOneConstGJ *local_c8;
  TwoOneConstGG *local_c0;
  TwoOneConstGC2 *local_b8;
  TwoOneConstGC1 *local_b0;
  TwoOneExpm40 *local_a8;
  TwoOne1DCurved *local_a0;
  TwoOneDivisionAnisotropic *local_98;
  TwoTwoSinCos *local_90;
  TwoOneSinCosAxis *local_88;
  TwoOneExpSinCos *local_80;
  TwoOneCosCos *local_78;
  TwoOneSinSin *local_70;
  TwoOneCos *local_68;
  TwoOneExpNX2 *local_60;
  OneOneP3 *local_58;
  OneOneP0 *local_50;
  TypeAcceleration local_48 [6];
  
  this->num_mc = in_num_mc;
  this->verbose = false;
  this->gpuid = -1;
  local_110 = (vector<TasGrid::TypeAcceleration,std::allocator<TasGrid::TypeAcceleration>> *)
              &this->available_acc;
  local_120 = (vector<TestType,std::allocator<TestType>> *)&this->int_only;
  local_130 = (vector<TestType,std::allocator<TestType>> *)&this->diff_only;
  local_128.container = &this->quad_int;
  local_118.container = &this->quad_diff;
  local_150.container = &this->int_diff;
  __result = &this->all_test_types;
  memset(local_110,0,0xc0);
  OneOneP0::OneOneP0(&this->f11p0);
  local_50 = &this->f11p0;
  OneOneP3::OneOneP3(&this->f11p3);
  local_58 = &this->f11p3;
  TwoOneExpNX2::TwoOneExpNX2(&this->f21nx2);
  local_68 = &this->f21cos;
  local_60 = &this->f21nx2;
  TwoOneCos::TwoOneCos(local_68);
  local_70 = &this->f21sinsin;
  TwoOneSinSin::TwoOneSinSin(local_70);
  local_78 = &this->f21coscos;
  TwoOneCosCos::TwoOneCosCos(local_78);
  local_80 = &this->f21expsincos;
  TwoOneExpSinCos::TwoOneExpSinCos(local_80);
  local_88 = &this->f21sincosaxis;
  TwoOneSinCosAxis::TwoOneSinCosAxis(local_88);
  local_90 = &this->f22sincos;
  TwoTwoSinCos::TwoTwoSinCos(local_90);
  local_98 = &this->f21aniso;
  TwoOneDivisionAnisotropic::TwoOneDivisionAnisotropic(local_98);
  local_a0 = &this->f21curved;
  TwoOne1DCurved::TwoOne1DCurved(local_a0);
  local_a8 = &this->f21sharp;
  TwoOneExpm40::TwoOneExpm40(local_a8);
  local_b0 = &this->f21constGC1;
  TwoOneConstGC1::TwoOneConstGC1(local_b0);
  local_b8 = &this->f21constGC2;
  TwoOneConstGC2::TwoOneConstGC2(local_b8);
  local_c0 = &this->f21constGG;
  TwoOneConstGG::TwoOneConstGG(local_c0);
  local_c8 = &this->f21constGJ;
  TwoOneConstGJ::TwoOneConstGJ(local_c8);
  local_d0 = &this->f21constGGL;
  TwoOneConstGGL::TwoOneConstGGL(local_d0);
  local_d8 = &this->f21constGH;
  TwoOneConstGH::TwoOneConstGH(local_d8);
  local_e0 = &this->f21nx2aniso;
  TwoOneENX2aniso::TwoOneENX2aniso(local_e0);
  local_e8 = &this->f22asym;
  TwoTwoExpAsym::TwoTwoExpAsym(local_e8);
  local_f0 = &this->f21expDomain;
  TwoOneExpShiftedDomain::TwoOneExpShiftedDomain(local_f0);
  local_f8 = &this->f21conformal;
  TwoOneConformalOne::TwoOneConformalOne(local_f8);
  local_100 = &this->f16active3;
  SixteenOneActive3::SixteenOneActive3(local_100);
  local_108 = &this->f23Kexpsincos;
  Two3KExpSinCos::Two3KExpSinCos(local_108);
  TwoOneC1C2Periodic::TwoOneC1C2Periodic(&this->f21c1c2periodic);
  local_48[0] = accel_none;
  local_48[1] = accel_cpu_blas;
  local_48[2] = accel_gpu_cublas;
  local_48[3] = accel_gpu_cuda;
  local_48[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_48;
  std::vector<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>::vector
            (&local_148,__l,&local_151);
  if (local_148.
      super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_148.
      super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar1 = local_148.
             super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_48[0] = *pTVar1;
      if (*pTVar1 == accel_none) {
        __position._M_current =
             (this->available_acc).
             super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->available_acc).
            super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<TasGrid::TypeAcceleration,std::allocator<TasGrid::TypeAcceleration>>::
          _M_realloc_insert<TasGrid::TypeAcceleration_const&>(local_110,__position,local_48);
        }
        else {
          *__position._M_current = accel_none;
          (this->available_acc).
          super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pTVar1 = pTVar1 + 1;
    } while (pTVar1 != local_148.
                       super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  __result_01.container = local_118.container;
  if (local_148.
      super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_148.
  super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_148.
                        super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<TestType,std::allocator<TestType>>::_M_assign_aux<TestType_const*>
            ((vector<TestType,std::allocator<TestType>> *)&this->quad_only,&local_148);
  __result_00.container = local_128.container;
  local_148.
  super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x300000001;
  std::vector<TestType,std::allocator<TestType>>::_M_assign_aux<TestType_const*>
            (local_120,&local_148);
  local_148.
  super__Vector_base<TasGrid::TypeAcceleration,_std::allocator<TasGrid::TypeAcceleration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x400000002;
  std::vector<TestType,std::allocator<TestType>>::_M_assign_aux<TestType_const*>
            (local_130,&local_148);
  std::vector<TestType,_std::allocator<TestType>_>::reserve
            (__result_00.container,
             ((long)(this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2) +
             ((long)(this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2));
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,__result_00);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,__result_00);
  std::vector<TestType,_std::allocator<TestType>_>::reserve
            (__result_01.container,
             ((long)(this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) +
             ((long)(this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2));
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,__result_01);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,__result_01);
  std::vector<TestType,_std::allocator<TestType>_>::reserve
            (local_150.container,
             ((long)(this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) +
             ((long)(this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2));
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,local_150);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,local_150);
  std::vector<TestType,_std::allocator<TestType>_>::reserve
            (__result,((long)(this->diff_only).
                             super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->diff_only).
                             super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) +
                      ((long)(this->int_only).
                             super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->int_only).
                             super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) +
                      ((long)(this->quad_only).
                             super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->quad_only).
                             super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2));
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->quad_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_>)__result);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->int_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_>)__result);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<TestType*,std::back_insert_iterator<std::vector<TestType,std::allocator<TestType>>>>
            ((this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->diff_only).super__Vector_base<TestType,_std::allocator<TestType>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<TestType,_std::allocator<TestType>_>_>)__result);
  return;
}

Assistant:

ExternalTester::ExternalTester(int in_num_mc) : num_mc(in_num_mc), verbose(false), gpuid(-1) {
    for(auto acc : std::vector<TypeAcceleration>{accel_none, accel_cpu_blas, accel_gpu_cublas, accel_gpu_cuda, accel_gpu_magma}){
        if (AccelerationMeta::isAvailable(acc)) available_acc.push_back(acc);
    }
    #ifdef Tasmanian_ENABLE_DPCPP
    test_queue.init_testing(gpuid);
    #endif
    // Hardcoded test types.
    quad_only = {type_integration};
    int_only = {type_nodal_interpolation, type_internal_interpolation};
    diff_only = {type_nodal_differentiation, type_internal_differentiation};
    quad_int.reserve(quad_only.size() + int_only.size());
    std::copy(quad_only.begin(), quad_only.end(), std::back_inserter(quad_int));
    std::copy(int_only.begin(), int_only.end(), std::back_inserter(quad_int));
    quad_diff.reserve(quad_only.size() + diff_only.size());
    std::copy(quad_only.begin(), quad_only.end(), std::back_inserter(quad_diff));
    std::copy(diff_only.begin(), diff_only.end(), std::back_inserter(quad_diff));
    int_diff.reserve(int_only.size() + diff_only.size());
    std::copy(int_only.begin(), int_only.end(), std::back_inserter(int_diff));
    std::copy(diff_only.begin(), diff_only.end(), std::back_inserter(int_diff));
    all_test_types.reserve(quad_only.size() + int_only.size() + diff_only.size());
    std::copy(quad_only.begin(), quad_only.end(), std::back_inserter(all_test_types));
    std::copy(int_only.begin(), int_only.end(), std::back_inserter(all_test_types));
    std::copy(diff_only.begin(), diff_only.end(), std::back_inserter(all_test_types));
}